

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_sol.c
# Opt level: O1

NLW2_SOLHandler_C * MakeSOLHandler_C(NLW2_SOLHandler_C *__return_storage_ptr__,CAPIExample *pex)

{
  NLW2_MakeSOLHandler_C_Default();
  __return_storage_ptr__->p_user_data_ = pex;
  __return_storage_ptr__->Header = CAPI_ex_Header;
  __return_storage_ptr__->OnDualSolution = OnDualSolution;
  __return_storage_ptr__->OnPrimalSolution = OnPrimalSolution;
  __return_storage_ptr__->OnObjno = OnObjno;
  __return_storage_ptr__->OnSolveCode = OnSolveCode;
  __return_storage_ptr__->OnIntSuffix = OnIntSuffix;
  __return_storage_ptr__->OnDblSuffix = OnDblSuffix;
  return __return_storage_ptr__;
}

Assistant:

NLW2_SOLHandler_C MakeSOLHandler_C(CAPIExample* pex) {
  NLW2_SOLHandler_C result
      = NLW2_MakeSOLHandler_C_Default();

  result.p_user_data_ = pex;

  result.Header = CAPI_ex_Header;
  // solve message: use default (print it)
  // AMPL options: use default
  result.OnDualSolution = OnDualSolution;
  result.OnPrimalSolution = OnPrimalSolution;
  result.OnObjno = OnObjno;
  result.OnSolveCode = OnSolveCode;
  result.OnIntSuffix = OnIntSuffix;
  result.OnDblSuffix = OnDblSuffix;

  return result;
}